

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

vw * VW::seed_vw_model(vw *vw_model,string *extra_args,trace_message_t trace_listener,
                      void *trace_context)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  element_type *peVar4;
  char *pcVar5;
  vw *this;
  undefined8 *in_RDI;
  vw *new_model;
  string serialized_options;
  shared_ptr<VW::config::base_option> *option;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  *__range1;
  options_serializer_boost_po serializer;
  options_serializer_boost_po *in_stack_fffffffffffffd28;
  vw *pvVar6;
  options_serializer_boost_po *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  string *this_00;
  options_serializer_boost_po *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd50;
  allocator *paVar7;
  undefined6 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  allocator local_281;
  void *in_stack_fffffffffffffd80;
  trace_message_t in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd97;
  io_buf *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  reference local_1f8;
  shared_ptr<VW::config::base_option> *local_1f0;
  __normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
  local_1e8 [3];
  undefined1 local_1d0 [24];
  undefined1 *local_1b8;
  undefined8 *local_8;
  
  local_8 = in_RDI;
  config::options_serializer_boost_po::options_serializer_boost_po(in_stack_fffffffffffffd40);
  (**(code **)(*(long *)local_8[0x4f] + 0x18))(local_1d0);
  local_1b8 = local_1d0;
  local_1e8[0]._M_current =
       (shared_ptr<VW::config::base_option> *)
       std::
       vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
       ::begin((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                *)in_stack_fffffffffffffd28);
  local_1f0 = (shared_ptr<VW::config::base_option> *)
              std::
              vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
              ::end((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                     *)in_stack_fffffffffffffd28);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                             *)in_stack_fffffffffffffd30,
                            (__normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                             *)in_stack_fffffffffffffd28), bVar2) {
    local_1f8 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                ::operator*(local_1e8);
    plVar1 = (long *)local_8[0x4f];
    peVar4 = std::
             __shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x17d27f);
    bVar3 = (**(code **)(*plVar1 + 8))(plVar1,&peVar4->m_name);
    if ((bVar3 & 1) != 0) {
      std::__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17d2b4);
      in_stack_fffffffffffffd5f =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
      if (!(bool)in_stack_fffffffffffffd5f) {
        std::__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x17d2e4);
        in_stack_fffffffffffffd5e =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
        if (!(bool)in_stack_fffffffffffffd5e) {
          std::
          __shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffd30);
          config::options_serializer_boost_po::add
                    (in_stack_fffffffffffffd30,(base_option *)in_stack_fffffffffffffd28);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
    ::operator++(local_1e8);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
             *)in_stack_fffffffffffffd40);
  config::options_serializer_boost_po::str_abi_cxx11_(in_stack_fffffffffffffd28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd5f,
                          CONCAT16(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)),
                 in_stack_fffffffffffffd50);
  std::operator+(in_stack_fffffffffffffd38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd30);
  this_00 = local_238;
  std::__cxx11::string::operator=(local_218,this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(local_258);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  paVar7 = &local_281;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd80,pcVar5,paVar7);
  this = initialize(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                    (bool)in_stack_fffffffffffffd97,in_stack_fffffffffffffd88,
                    in_stack_fffffffffffffd80);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  pvVar6 = this;
  free_it((void *)0x17d474);
  parameters::shallow_copy((parameters *)this,(parameters *)in_stack_fffffffffffffd28);
  pvVar6->sd = (shared_data *)*local_8;
  std::__cxx11::string::~string(local_218);
  config::options_serializer_boost_po::~options_serializer_boost_po
            ((options_serializer_boost_po *)0x17d4ce);
  return pvVar6;
}

Assistant:

vw* seed_vw_model(vw* vw_model, const string extra_args, trace_message_t trace_listener, void* trace_context)
{
  options_serializer_boost_po serializer;
  for (auto const& option : vw_model->options->get_all_options())
  {
    if (vw_model->options->was_supplied(option->m_name))
    {
      // ignore no_stdin since it will be added by vw::initialize, and ignore -i since we don't want to reload the
      // model.
      if (option->m_name == "no_stdin" || option->m_name == "initial_regressor")
      {
        continue;
      }

      serializer.add(*option);
    }
  }

  auto serialized_options = serializer.str();
  serialized_options = serialized_options + " " + extra_args;

  vw* new_model =
      VW::initialize(serialized_options.c_str(), nullptr, true /* skipModelLoad */, trace_listener, trace_context);
  free_it(new_model->sd);

  // reference model states stored in the specified VW instance
  new_model->weights.shallow_copy(vw_model->weights);  // regressor
  new_model->sd = vw_model->sd;                        // shared data

  return new_model;
}